

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O1

int Gia_Sim2CompareZero(uint *p0,int nWords,int fCompl)

{
  ulong uVar1;
  
  if (fCompl == 0) {
    if (0 < nWords) {
      uVar1 = 0;
      do {
        if (p0[uVar1] != 0) {
          return 0;
        }
        uVar1 = uVar1 + 1;
      } while ((uint)nWords != uVar1);
    }
  }
  else if (0 < nWords) {
    uVar1 = 0;
    do {
      if (p0[uVar1] != 0xffffffff) {
        return 0;
      }
      uVar1 = uVar1 + 1;
    } while ((uint)nWords != uVar1);
  }
  return 1;
}

Assistant:

int Gia_Sim2CompareZero( unsigned * p0, int nWords, int fCompl )
{
    int w;
    if ( !fCompl )
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != 0 )
                return 0;
        return 1;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != ~0 )
                return 0;
        return 1;
    }
}